

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::anon_unknown_24::SourceLocationCommentPrinter::FormatComment
          (string *__return_storage_ptr__,SourceLocationCommentPrinter *this,string *comment_text)

{
  size_t sVar1;
  string *extraout_RAX;
  string *psVar2;
  long in_RCX;
  ulong uVar3;
  ulong uVar4;
  string *psVar5;
  long lVar6;
  size_t in_R9;
  string_view format;
  string stripped_comment;
  const_iterator __begin3;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_78;
  undefined1 local_70;
  size_type local_68;
  pointer local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  local_b8._0_8_ = local_b8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,comment_text,(long)&(comment_text->_M_dataplus)._M_p + in_RCX);
  uVar4 = local_b8._8_8_;
  if (0 < (long)local_b8._8_8_ >> 2) {
    uVar4 = (ulong)((uint)local_b8._8_8_ & 3);
    lVar6 = ((long)local_b8._8_8_ >> 2) + 1;
    uVar3 = local_b8._8_8_;
    do {
      in_R9 = (size_t)*(byte *)(local_b8._0_8_ + (uVar3 - 1));
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[in_R9] & 8) == 0) {
        psVar2 = (string *)(local_b8._0_8_ + uVar3);
        goto LAB_00ef5c6a;
      }
      in_R9 = (size_t)*(byte *)(local_b8._0_8_ + (uVar3 - 2));
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[in_R9] & 8) == 0) {
        psVar2 = (string *)(local_b8._0_8_ + (uVar3 - 1));
        goto LAB_00ef5c6a;
      }
      in_R9 = (size_t)*(byte *)(local_b8._0_8_ + (uVar3 - 3));
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[in_R9] & 8) == 0) {
        psVar2 = (string *)(local_b8._0_8_ + (uVar3 - 2));
        goto LAB_00ef5c6a;
      }
      in_R9 = (size_t)*(byte *)(local_b8._0_8_ + (uVar3 - 4));
      if (((&absl::lts_20250127::ascii_internal::kPropertyBits)[in_R9] & 8) == 0) {
        psVar2 = (string *)(local_b8._0_8_ + (uVar3 - 3));
        goto LAB_00ef5c6a;
      }
      uVar3 = uVar3 - 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  psVar5 = (string *)(local_b8._0_8_ + uVar4);
  lVar6 = (long)psVar5 - local_b8._0_8_;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      psVar2 = (string *)local_b8._0_8_;
      if ((lVar6 != 3) ||
         (psVar2 = psVar5,
         ((&absl::lts_20250127::ascii_internal::kPropertyBits)
          [(byte)psVar5[-1].field_2._M_local_buf[0xf]] & 8) == 0)) goto LAB_00ef5c6a;
      psVar5 = (string *)((long)&psVar5[-1].field_2 + 0xf);
    }
    psVar2 = psVar5;
    if (((&absl::lts_20250127::ascii_internal::kPropertyBits)
         [(byte)psVar5[-1].field_2._M_local_buf[0xf]] & 8) == 0) goto LAB_00ef5c6a;
    psVar5 = (string *)((long)&psVar5[-1].field_2 + 0xf);
  }
  psVar2 = psVar5;
  if (((&absl::lts_20250127::ascii_internal::kPropertyBits)
       [(byte)psVar5[-1].field_2._M_local_buf[0xf]] & 8) != 0) {
    psVar2 = (string *)local_b8._0_8_;
  }
LAB_00ef5c6a:
  uVar4 = (long)psVar2 - local_b8._0_8_;
  if ((ulong)local_b8._8_8_ < uVar4) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
  }
  *(char *)(local_b8._0_8_ + uVar4) = '\0';
  local_b8._8_8_ = uVar4;
  absl::lts_20250127::StripLeadingAsciiWhitespace((Nonnull<std::string_*>)local_b8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = &local_48;
  local_48.text_._M_len = local_b8._8_8_;
  local_48.text_._M_str = (char *)local_b8._0_8_;
  local_48.delimiter_.c_ = '\n';
  local_98._M_allocated_capacity = 0;
  local_98._8_4_ = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_70 = 10;
  if ((string *)local_b8._0_8_ == (string *)0x0) {
    local_98._8_4_ = 2;
    local_98._M_allocated_capacity = local_b8._8_8_;
  }
  else {
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&local_98);
  }
  sVar1 = local_48.text_._M_len;
  while ((local_98._8_4_ != 2 || (local_98._M_allocated_capacity != sVar1))) {
    local_60 = (this->prefix_)._M_dataplus._M_p;
    local_68 = (this->prefix_)._M_string_length;
    local_58 = local_88;
    uStack_50 = uStack_80;
    format._M_str = (char *)&local_68;
    format._M_len = (size_t)"$0// $1\n";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)&DAT_00000008,
               format,(Nullable<const_absl::string_view_*>)0x2,in_R9);
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++((SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)&local_98);
  }
  psVar2 = (string *)(local_b8 + 0x10);
  if ((string *)local_b8._0_8_ != psVar2) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

std::string FormatComment(const std::string& comment_text) {
    std::string stripped_comment = comment_text;
    absl::StripAsciiWhitespace(&stripped_comment);
    std::string output;
    for (absl::string_view line : absl::StrSplit(stripped_comment, '\n')) {
      absl::SubstituteAndAppend(&output, "$0// $1\n", prefix_, line);
    }
    return output;
  }